

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::QueryCase::iterate(QueryCase *this)

{
  undefined8 *puVar1;
  TestLog *log;
  long lVar2;
  byte bVar3;
  undefined8 uVar4;
  char *pcVar5;
  byte bVar6;
  int i;
  int iVar7;
  GLenum GVar8;
  undefined4 extraout_var;
  pointer pBVar9;
  ulong uVar10;
  pointer pBVar11;
  pointer pBVar12;
  long *plVar13;
  int i_1;
  ulong uVar14;
  size_type *psVar15;
  pointer pBVar16;
  int ndx_1;
  float *pfVar17;
  pointer pBVar18;
  size_t __n;
  int coordNdx;
  long lVar19;
  size_t sVar20;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  *this_00;
  int ndx_2;
  uint uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  CallLogWrapper gl;
  ScopedLogSection section;
  StateQueryMemoryWriteGuard<float[8]> state;
  BoundingBox boundingBox;
  Random rnd;
  pointer local_370;
  pointer local_360;
  string local_358;
  CallLogWrapper local_338;
  ScopedLogSection local_320;
  Enum<int,_1UL> local_318;
  long local_308 [2];
  undefined1 local_2f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  long local_2c8;
  long lStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  long local_2a8;
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [4];
  ulong local_230;
  undefined1 local_228 [8];
  undefined1 auStack_220 [8];
  undefined8 local_218;
  undefined8 uStack_210;
  ios_base local_1b8 [8];
  ios_base local_1b0 [272];
  Enum<int,_1UL> local_a0;
  Enum<int,_1UL> local_90;
  Enum<int,_1UL> local_80;
  Enum<int,_1UL> local_70;
  Enum<int,_1UL> local_60;
  Enum<int,_1UL> local_50;
  deRandom local_40;
  
  if (Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases == '\0') {
    _GLOBAL__N_1::QueryCase::iterate();
  }
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_338,(Functions *)CONCAT44(extraout_var,iVar7),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  __n = 0xde3210;
  deRandom_init(&local_40,0xde3210);
  pBVar9 = std::
           _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
           ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                          *)0x6,__n);
  lVar19 = 0;
  do {
    uVar4 = *(undefined8 *)((long)iterate::fixedCases[0].min.m_data + lVar19 + 8);
    puVar1 = (undefined8 *)((long)(pBVar9->min).m_data + lVar19);
    *puVar1 = *(undefined8 *)((long)iterate::fixedCases[0].min.m_data + lVar19);
    puVar1[1] = uVar4;
    uVar4 = *(undefined8 *)((long)iterate::fixedCases[0].max.m_data + lVar19 + 8);
    puVar1 = (undefined8 *)((long)(pBVar9->max).m_data + lVar19);
    *puVar1 = *(undefined8 *)((long)iterate::fixedCases[0].max.m_data + lVar19);
    puVar1[1] = uVar4;
    bVar22 = lVar19 != 0xa0;
    lVar19 = lVar19 + 0x20;
  } while (bVar22);
  local_360 = pBVar9 + 6;
  pBVar16 = pBVar9 + 1 + 5;
  iVar7 = 0;
  do {
    local_218 = 0;
    uStack_210 = 0;
    local_228 = (undefined1  [8])0x0;
    auStack_220 = (undefined1  [8])0x0;
    pfVar17 = (float *)local_228;
    lVar19 = 0;
    do {
      fVar23 = deRandom_getFloat(&local_40);
      *pfVar17 = fVar23 * 8.0 + -4.0;
      lVar19 = lVar19 + 1;
      pfVar17 = pfVar17 + 1;
    } while (lVar19 != 8);
    if (pBVar16 == local_360) {
      sVar20 = (long)pBVar16 - (long)pBVar9;
      if (sVar20 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar10 = (long)sVar20 >> 5;
      uVar14 = uVar10 + (uVar10 == 0);
      this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                 *)(uVar14 + uVar10);
      if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
           *)0x3fffffffffffffe < this_00) {
        this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                   *)0x3ffffffffffffff;
      }
      if (CARRY8(uVar14,uVar10)) {
        this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                   *)0x3ffffffffffffff;
      }
      pBVar11 = std::
                _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                ::_M_allocate(this_00,__n);
      *(undefined8 *)((long)pBVar11 + sVar20) = local_228;
      ((undefined8 *)((long)pBVar11 + sVar20))[1] = auStack_220;
      puVar1 = (undefined8 *)((long)pBVar11 + sVar20 + 0x10);
      *puVar1 = local_218;
      puVar1[1] = uStack_210;
      pBVar18 = pBVar11;
      for (pBVar12 = pBVar9; pBVar12 != pBVar16; pBVar12 = pBVar12 + 1) {
        lVar19 = 0;
        do {
          (pBVar18->min).m_data[lVar19] = (pBVar12->min).m_data[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        lVar19 = 4;
        do {
          (pBVar18->min).m_data[lVar19] = (pBVar12->min).m_data[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 8);
        pBVar18 = pBVar18 + 1;
      }
      if (pBVar9 != (pointer)0x0) {
        operator_delete(pBVar9,sVar20);
        __n = sVar20;
      }
      local_360 = pBVar11 + (long)this_00;
      pBVar9 = pBVar11;
      pBVar16 = pBVar18;
    }
    else {
      lVar19 = 0;
      do {
        (pBVar16->min).m_data[lVar19] = *(float *)(local_228 + lVar19 * 4);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      lVar19 = 4;
      do {
        (pBVar16->min).m_data[lVar19] = *(float *)(local_228 + lVar19 * 4);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
    }
    pBVar16 = pBVar16 + 1;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 9);
  local_338.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  uVar21 = (uint)((ulong)((long)pBVar16 - (long)pBVar9) >> 5);
  if (0 < (int)uVar21) {
    uVar10 = 0;
    local_370 = pBVar9;
    do {
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2f8._0_8_ = local_2f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Iteration","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      local_230 = uVar10 + 1;
      std::ostream::operator<<((ostringstream *)local_228,(int)local_230);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base((ios_base *)(auStack_220 + 0x68));
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0x1c55407);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_358.field_2._M_allocated_capacity = *psVar15;
        local_358.field_2._8_8_ = plVar13[3];
      }
      else {
        local_358.field_2._M_allocated_capacity = *psVar15;
        local_358._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_358._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_320,log,(string *)local_2f8,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if (local_318.m_getName != (GetNameFunc)local_308) {
        operator_delete(local_318.m_getName,local_308[0] + 1);
      }
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
      }
      glu::CallLogWrapper::glPrimitiveBoundingBox
                (&local_338,pBVar9[uVar10].min.m_data[0],pBVar9[uVar10].min.m_data[1],
                 pBVar9[uVar10].min.m_data[2],pBVar9[uVar10].min.m_data[3],
                 pBVar9[uVar10].max.m_data[0],pBVar9[uVar10].max.m_data[1],
                 pBVar9[uVar10].max.m_data[2],pBVar9[uVar10].max.m_data[3]);
      switch(this->m_method) {
      case QUERY_FLOAT:
        local_2a8 = -0x2121212121212122;
        lStack_2a0 = -0x2121212121212122;
        local_2b8._M_allocated_capacity = 0xdededededededede;
        local_2b8._8_4_ = -8.0297587e+18;
        local_2b8._12_4_ = -8.0297587e+18;
        local_2c8 = -0x2121212121212122;
        lStack_2c0 = -0x2121212121212122;
        local_2d8._M_allocated_capacity = 0xdededededededede;
        local_2d8._8_8_ = 0xdededededededede;
        local_2f8._16_8_ = 0xdededededededede;
        local_2f8._24_8_ = 0xdededededededede;
        local_2f8._0_8_ = (pointer)0xdededededededede;
        local_2f8[8] = 0xde;
        local_2f8[9] = 0xde;
        local_2f8[10] = 0xde;
        local_2f8[0xb] = 0xde;
        local_2f8[0xc] = 0xde;
        local_2f8[0xd] = 0xde;
        local_2f8[0xe] = 0xde;
        local_2f8[0xf] = 0xde;
        glu::CallLogWrapper::glGetFloatv(&local_338,0x92be,(GLfloat *)&local_2d8);
        GVar8 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar8,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x138);
        bVar22 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<float[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (bVar22) {
          local_228 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"glGetFloatv returned ",0x15);
          local_358._M_dataplus._M_p = (pointer)&local_2d8;
          local_358._M_string_length = (size_type)&local_2b8;
          tcu::Format::operator<<((ostream *)auStack_220,(Array<float_*> *)&local_358);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          pBVar18 = pBVar9 + uVar10;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
          std::ios_base::~ios_base(local_1b0);
          lVar19 = 0;
          pBVar16 = local_370;
          bVar6 = 0;
          do {
            bVar3 = bVar6;
            bVar22 = *(float *)((long)&local_2d8 + lVar19 * 4) != (pBVar16->min).m_data[0];
            lVar19 = lVar19 + 1;
            pBVar16 = (pointer)((pBVar16->min).m_data + 1);
            bVar6 = bVar3 | bVar22;
          } while (lVar19 != 8);
          if (!(bool)(bVar3 | bVar22)) break;
          local_228 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"Error, unexpected value\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"Expected [",10)
          ;
          std::ostream::_M_insert<double>((double)(pBVar18->min).m_data[0]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->min).m_data[1]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->min).m_data[2]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->min).m_data[3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->max).m_data[0]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->max).m_data[1]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->max).m_data[2]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar18->max).m_data[3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0163aa20:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
          std::ios_base::~ios_base(local_1b0);
        }
        goto LAB_0163b158;
      case QUERY_BOOLEAN:
        local_2f8._16_8_ = 0xdededededededede;
        local_2f8._0_8_ = (pointer)0xdededededededede;
        local_2f8[8] = 0xde;
        local_2f8[9] = 0xde;
        local_2f8[10] = 0xde;
        local_2f8[0xb] = 0xde;
        local_2f8[0xc] = 0xde;
        local_2f8[0xd] = 0xde;
        local_2f8[0xe] = 0xde;
        local_2f8[0xf] = 0xde;
        glu::CallLogWrapper::glGetBooleanv(&local_338,0x92be,local_2f8 + 8);
        GVar8 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar8,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x1bc);
        bVar22 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::
                 verifyValidity((StateQueryMemoryWriteGuard<unsigned_char[8]> *)local_2f8,
                                (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (bVar22) {
          local_228 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"glGetBooleanv returned [",0x18);
          local_358._M_dataplus._M_p = (pointer)glu::getBooleanName;
          local_358._M_string_length = CONCAT44(local_358._M_string_length._4_4_,(uint)local_2f8[8])
          ;
          tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_358,(ostream *)auStack_220)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_318.m_getName = glu::getBooleanName;
          local_318.m_value = (int)local_2f8[9];
          tcu::Format::Enum<int,_1UL>::toStream(&local_318,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_50.m_getName = glu::getBooleanName;
          local_50.m_value = (int)local_2f8[10];
          tcu::Format::Enum<int,_1UL>::toStream(&local_50,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_60.m_getName = glu::getBooleanName;
          local_60.m_value = (int)local_2f8[0xb];
          tcu::Format::Enum<int,_1UL>::toStream(&local_60,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_70.m_getName = glu::getBooleanName;
          local_70.m_value = (int)local_2f8[0xc];
          tcu::Format::Enum<int,_1UL>::toStream(&local_70,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_80.m_getName = glu::getBooleanName;
          local_80.m_value = (int)local_2f8[0xd];
          tcu::Format::Enum<int,_1UL>::toStream(&local_80,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_90.m_getName = glu::getBooleanName;
          local_90.m_value = (int)local_2f8[0xe];
          tcu::Format::Enum<int,_1UL>::toStream(&local_90,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
          local_a0.m_getName = glu::getBooleanName;
          local_a0.m_value = (int)local_2f8[0xf];
          tcu::Format::Enum<int,_1UL>::toStream(&local_a0,(ostream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"]\n",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
          std::ios_base::~ios_base(local_1b0);
          lVar19 = 0;
          pBVar16 = local_370;
          bVar6 = 0;
          do {
            bVar3 = bVar6;
            bVar22 = (bool)local_2f8[lVar19 + 8] != ((pBVar16->min).m_data[0] != 0.0);
            lVar19 = lVar19 + 1;
            pBVar16 = (pointer)((pBVar16->min).m_data + 1);
            bVar6 = bVar3 | bVar22;
          } while (lVar19 != 8);
          if (!(bool)(bVar3 | bVar22)) break;
          local_228 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"Error, unexpected value\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"Expected [",10)
          ;
          lVar19 = 0;
          pBVar16 = local_370;
          do {
            if (lVar19 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
            }
            fVar23 = (pBVar16->min).m_data[0];
            pcVar5 = "mapped_ == GL_FALSE";
            if (fVar23 != 0.0) {
              pcVar5 = "mapped_ == GL_TRUE";
            }
            if (NAN(fVar23)) {
              pcVar5 = "mapped_ == GL_TRUE";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_220,pcVar5 + 0xb,8 - (ulong)(-(uint)(fVar23 != 0.0) & 1));
            lVar19 = lVar19 + 1;
            pBVar16 = (pointer)((pBVar16->min).m_data + 1);
          } while (lVar19 != 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0163b132:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
          std::ios_base::~ios_base(local_1b0);
        }
LAB_0163b158:
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Unexpected query result");
        break;
      case QUERY_INT:
        local_2a8 = -0x2121212121212122;
        lStack_2a0 = -0x2121212121212122;
        local_2b8._M_allocated_capacity = 0xdededededededede;
        local_2b8._8_4_ = -8.0297587e+18;
        local_2b8._12_4_ = -8.0297587e+18;
        local_2c8 = -0x2121212121212122;
        lStack_2c0 = -0x2121212121212122;
        local_2d8._M_allocated_capacity = 0xdededededededede;
        local_2d8._8_8_ = 0xdededededededede;
        local_2f8._16_8_ = 0xdededededededede;
        local_2f8._24_8_ = 0xdededededededede;
        local_2f8._0_8_ = (pointer)0xdededededededede;
        local_2f8[8] = 0xde;
        local_2f8[9] = 0xde;
        local_2f8[10] = 0xde;
        local_2f8[0xb] = 0xde;
        local_2f8[0xc] = 0xde;
        local_2f8[0xd] = 0xde;
        local_2f8[0xe] = 0xde;
        local_2f8[0xf] = 0xde;
        glu::CallLogWrapper::glGetIntegerv(&local_338,0x92be,(GLint *)local_2d8._M_local_buf);
        GVar8 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar8,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x15a);
        bVar22 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<int[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (!bVar22) goto LAB_0163b158;
        local_228 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_220,"glGetIntegerv returned ",0x17);
        local_358._M_dataplus._M_p = (pointer)&local_2d8;
        local_358._M_string_length = (size_type)&local_2b8;
        tcu::Format::operator<<((ostream *)auStack_220,(Array<int_*> *)&local_358);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
        std::ios_base::~ios_base(local_1b0);
        lVar19 = 0;
        bVar22 = false;
        pBVar16 = local_370;
        do {
          iVar7 = *(int *)((long)&local_2d8 + lVar19 * 4);
          fVar23 = (pBVar16->min).m_data[0];
          fVar24 = ceilf(fVar23 + -0.5);
          if (iVar7 != (int)fVar24) {
            fVar23 = floorf(fVar23 + 0.5);
            bVar22 = (bool)(bVar22 | iVar7 != (int)fVar23);
          }
          lVar19 = lVar19 + 1;
          pBVar16 = (pointer)((pBVar16->min).m_data + 1);
        } while (lVar19 != 8);
        if (bVar22) {
          local_228 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"Error, unexpected value\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"Expected [",10)
          ;
          lVar19 = 0;
          pBVar16 = local_370;
          do {
            fVar23 = (pBVar16->min).m_data[0];
            fVar24 = ceilf(fVar23 + -0.5);
            fVar23 = floorf(fVar23 + 0.5);
            if (lVar19 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
            }
            iVar7 = (int)fVar24;
            if (iVar7 == (int)fVar23) {
              std::ostream::operator<<(auStack_220,iVar7);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"{",1);
              std::ostream::operator<<((ostream *)auStack_220,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
              std::ostream::operator<<((ostream *)auStack_220,(int)fVar23);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"}",1);
            }
            lVar19 = lVar19 + 1;
            pBVar16 = (pointer)((pBVar16->min).m_data + 1);
          } while (lVar19 != 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0163aa20;
        }
        break;
      case QUERY_INT64:
        memset(local_2f8,0xde,0xc0);
        glu::CallLogWrapper::glGetInteger64v(&local_338,0x92be,(GLint64 *)local_2b8._M_local_buf);
        GVar8 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar8,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x18b);
        bVar22 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<long[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (!bVar22) goto LAB_0163b158;
        local_228 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_220,"glGetInteger64v returned ",0x19);
        local_358._M_dataplus._M_p = (pointer)&local_2b8;
        local_358._M_string_length = (size_type)local_278;
        tcu::Format::operator<<((ostream *)auStack_220,(Array<long_*> *)&local_358);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
        std::ios_base::~ios_base(local_1b0);
        lVar19 = 0;
        bVar22 = false;
        pBVar16 = local_370;
        do {
          lVar2 = *(long *)((long)&local_2b8 + lVar19 * 8);
          fVar23 = (pBVar16->min).m_data[0];
          fVar24 = ceilf(fVar23 + -0.5);
          if (lVar2 != (long)fVar24) {
            fVar23 = floorf(fVar23 + 0.5);
            bVar22 = (bool)(bVar22 | lVar2 != (long)fVar23);
          }
          lVar19 = lVar19 + 1;
          pBVar16 = (pointer)((pBVar16->min).m_data + 1);
        } while (lVar19 != 8);
        if (bVar22) {
          local_228 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"Error, unexpected value\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"Expected [",10)
          ;
          lVar19 = 0;
          pBVar16 = local_370;
          do {
            fVar23 = (pBVar16->min).m_data[0];
            fVar24 = ceilf(fVar23 + -0.5);
            fVar23 = floorf(fVar23 + 0.5);
            if (lVar19 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
            }
            if ((long)fVar24 == (long)fVar23) {
              std::ostream::_M_insert<long>((long)auStack_220);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"{",1);
              std::ostream::_M_insert<long>((long)auStack_220);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,", ",2);
              std::ostream::_M_insert<long>((long)auStack_220);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"}",1);
            }
            lVar19 = lVar19 + 1;
            pBVar16 = (pointer)((pBVar16->min).m_data + 1);
          } while (lVar19 != 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0163b132;
        }
      }
      tcu::TestLog::endSection(local_320.m_log);
      local_370 = local_370 + 1;
      uVar10 = local_230;
    } while (local_230 != (uVar21 & 0x7fffffff));
  }
  if (pBVar9 != (pointer)0x0) {
    operator_delete(pBVar9,(long)local_360 - (long)pBVar9);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_338);
  return STOP;
}

Assistant:

QueryCase::IterateResult QueryCase::iterate (void)
{
	static const BoundingBox fixedCases[] =
	{
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f) },
		{ tcu::Vec4(-0.0f, -0.0f, -0.0f, -0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f, -0.0f) },
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 1.0f,  1.0f,  1.0f, -1.0f) },
		{ tcu::Vec4( 2.0f,  2.0f,  2.0f,  2.0f), tcu::Vec4( 1.5f,  1.5f,  1.5f,  1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  1.0f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  0.3f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.2f) },
	};

	const int					numRandomCases	= 9;
	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	de::Random					rnd				(0xDE3210);
	std::vector<BoundingBox>	cases;

	cases.insert(cases.begin(), DE_ARRAY_BEGIN(fixedCases), DE_ARRAY_END(fixedCases));
	for (int ndx = 0; ndx < numRandomCases; ++ndx)
	{
		BoundingBox	boundingBox;

		// parameter evaluation order is not guaranteed, cannot just do "max = (rand(), rand(), ...)
		for (int coordNdx = 0; coordNdx < 8; ++coordNdx)
			boundingBox.getComponentAccess(coordNdx) = rnd.getFloat(-4.0f, 4.0f);

		cases.push_back(boundingBox);
	}

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int caseNdx = 0; caseNdx < (int)cases.size(); ++caseNdx)
	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Iteration", "Iteration " + de::toString(caseNdx+1));
		const BoundingBox&			boundingBox	= cases[caseNdx];

		gl.glPrimitiveBoundingBox(boundingBox.min.x(), boundingBox.min.y(), boundingBox.min.z(), boundingBox.min.w(),
								  boundingBox.max.x(), boundingBox.max.y(), boundingBox.max.z(), boundingBox.max.w());

		if (!verifyState(gl, boundingBox))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected query result");
	}

	return STOP;
}